

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O2

void llama_sampler_chain_free(llama_sampler *smpl)

{
  void *pvVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  
  pvVar1 = smpl->ctx;
  puVar2 = *(undefined8 **)((long)pvVar1 + 0x10);
  for (puVar3 = *(undefined8 **)((long)pvVar1 + 8); puVar3 != puVar2; puVar3 = puVar3 + 1) {
    llama_sampler_free((llama_sampler *)*puVar3);
  }
  if (pvVar1 != (void *)0x0) {
    std::_Vector_base<llama_sampler_*,_std::allocator<llama_sampler_*>_>::~_Vector_base
              ((_Vector_base<llama_sampler_*,_std::allocator<llama_sampler_*>_> *)((long)pvVar1 + 8)
              );
  }
  operator_delete(pvVar1,0x30);
  return;
}

Assistant:

static void llama_sampler_chain_free(struct llama_sampler * smpl) {
    auto * chain = (llama_sampler_chain *) smpl->ctx;

    for (auto * smpl : chain->samplers) {
        llama_sampler_free(smpl);
    }

    delete chain;
}